

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_force(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *pCVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  CHAR_DATA *pCVar6;
  char arg [4608];
  char buf [4608];
  char arg2 [4608];
  char local_3638 [4608];
  char local_2438 [4608];
  char local_1238 [4616];
  
  pcVar5 = one_argument(argument,local_3638);
  if ((local_3638[0] == '\0') || (*pcVar5 == '\0')) {
    pcVar5 = "Force whom to do what?\n\r";
    goto LAB_0026b82b;
  }
  one_argument(pcVar5,local_1238);
  bVar2 = str_cmp(local_1238,"delete");
  if ((!bVar2) || (bVar2 = str_prefix(local_1238,"mob"), !bVar2)) {
    pcVar5 = "That will NOT be done.\n\r";
    goto LAB_0026b82b;
  }
  sprintf(local_2438,"$n forces you to \'%s\'.",pcVar5);
  bVar2 = str_cmp(local_3638,"all");
  if (bVar2) {
    bVar2 = str_cmp(local_3638,"players");
    if (bVar2) {
      bVar2 = str_cmp(local_3638,"gods");
      if (bVar2) {
        pCVar6 = get_char_world(ch,local_3638);
        if (pCVar6 == (CHAR_DATA *)0x0) {
          pcVar5 = "They aren\'t here.\n\r";
          goto LAB_0026b82b;
        }
        if (pCVar6 == ch) {
          pcVar5 = "Aye aye, right away!\n\r";
          goto LAB_0026b82b;
        }
        bVar2 = is_room_owner(ch,pCVar6->in_room);
        if ((((!bVar2) && (ch->in_room != pCVar6->in_room)) &&
            (bVar2 = room_is_private(pCVar6->in_room), bVar2)) &&
           (bVar2 = is_trusted(ch,0x3c), !bVar2)) {
          pcVar5 = "That character is in a private room.\n\r";
          goto LAB_0026b82b;
        }
        iVar3 = get_trust(pCVar6);
        iVar4 = get_trust(ch);
        if (iVar4 <= iVar3) {
          pcVar5 = "Do it yourself!\n\r";
          goto LAB_0026b82b;
        }
        bVar2 = is_npc(pCVar6);
        if ((!bVar2) && (iVar3 = get_trust(ch), iVar3 < 0x39)) goto LAB_0026b999;
        act(local_2438,ch,(void *)0x0,pCVar6,2);
        interpret(pCVar6,pcVar5);
      }
      else {
        iVar3 = get_trust(ch);
        if (iVar3 < 0x3a) goto LAB_0026b999;
        if (char_list != (CHAR_DATA *)0x0) {
          pCVar6 = char_list;
          do {
            pCVar1 = pCVar6->next;
            bVar2 = is_npc(pCVar6);
            if (!bVar2) {
              iVar3 = get_trust(pCVar6);
              iVar4 = get_trust(ch);
              if ((iVar3 < iVar4) && (0x32 < pCVar6->level)) {
                act(local_2438,ch,(void *)0x0,pCVar6,2);
                interpret(pCVar6,pcVar5);
              }
            }
            pCVar6 = pCVar1;
          } while (pCVar1 != (CHAR_DATA *)0x0);
        }
      }
    }
    else {
      iVar3 = get_trust(ch);
      if (iVar3 < 0x3a) goto LAB_0026b999;
      if (char_list != (CHAR_DATA *)0x0) {
        pCVar6 = char_list;
        do {
          pCVar1 = pCVar6->next;
          bVar2 = is_npc(pCVar6);
          if (!bVar2) {
            iVar3 = get_trust(pCVar6);
            iVar4 = get_trust(ch);
            if ((iVar3 < iVar4) && (pCVar6->level < 0x33)) {
              act(local_2438,ch,(void *)0x0,pCVar6,2);
              interpret(pCVar6,pcVar5);
            }
          }
          pCVar6 = pCVar1;
        } while (pCVar1 != (CHAR_DATA *)0x0);
      }
    }
  }
  else {
    iVar3 = get_trust(ch);
    if ((iVar3 < 0x39) && (bVar2 = str_cmp(local_1238,"save"), bVar2)) {
LAB_0026b999:
      pcVar5 = "Not at your level!\n\r";
      goto LAB_0026b82b;
    }
    if (char_list != (CHAR_DATA *)0x0) {
      pCVar6 = char_list;
      do {
        pCVar1 = pCVar6->next;
        bVar2 = is_npc(pCVar6);
        if (!bVar2) {
          iVar3 = get_trust(pCVar6);
          iVar4 = get_trust(ch);
          if (iVar3 < iVar4) {
            bVar2 = can_see(pCVar6,ch);
            if (!bVar2) {
              sprintf(local_2438,"An irresistible urge forces you to \'%s\'.",pcVar5);
            }
            act(local_2438,ch,(void *)0x0,pCVar6,2);
            interpret(pCVar6,pcVar5);
          }
        }
        pCVar6 = pCVar1;
      } while (pCVar1 != (CHAR_DATA *)0x0);
    }
  }
  pcVar5 = "Ok.\n\r";
LAB_0026b82b:
  send_to_char(pcVar5,ch);
  return;
}

Assistant:

void do_force(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *vch, *vch_next;
	char buf[MAX_STRING_LENGTH];
	char arg[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];

	argument = one_argument(argument, arg);

	if (arg[0] == '\0' || argument[0] == '\0')
	{
		send_to_char("Force whom to do what?\n\r", ch);
		return;
	}

	one_argument(argument, arg2);

	if (!str_cmp(arg2, "delete") || !str_prefix(arg2, "mob"))
	{
		send_to_char("That will NOT be done.\n\r", ch);
		return;
	}

	sprintf(buf, "$n forces you to '%s'.", argument);

	if (!str_cmp(arg, "all"))
	{
		if (get_trust(ch) < MAX_LEVEL - 3 && str_cmp(arg2, "save"))
		{
			send_to_char("Not at your level!\n\r", ch);
			return;
		}

		for (vch = char_list; vch != nullptr; vch = vch_next)
		{
			vch_next = vch->next;

			if (!is_npc(vch) && get_trust(vch) < get_trust(ch))
			{
				if (!can_see(vch, ch))
					sprintf(buf, "An irresistible urge forces you to '%s'.", argument);

				act(buf, ch, nullptr, vch, TO_VICT);
				interpret(vch, argument);
			}
		}
	}
	else if (!str_cmp(arg, "players"))
	{
		if (get_trust(ch) < MAX_LEVEL - 2)
		{
			send_to_char("Not at your level!\n\r", ch);
			return;
		}

		for (vch = char_list; vch != nullptr; vch = vch_next)
		{
			vch_next = vch->next;

			if (!is_npc(vch) && get_trust(vch) < get_trust(ch) && vch->level < LEVEL_HERO)
			{
				act(buf, ch, nullptr, vch, TO_VICT);
				interpret(vch, argument);
			}
		}
	}
	else if (!str_cmp(arg, "gods"))
	{
		if (get_trust(ch) < MAX_LEVEL - 2)
		{
			send_to_char("Not at your level!\n\r", ch);
			return;
		}

		for (vch = char_list; vch != nullptr; vch = vch_next)
		{
			vch_next = vch->next;

			if (!is_npc(vch) && get_trust(vch) < get_trust(ch) && vch->level >= LEVEL_HERO)
			{
				act(buf, ch, nullptr, vch, TO_VICT);
				interpret(vch, argument);
			}
		}
	}
	else
	{
		CHAR_DATA *victim = get_char_world(ch, arg);

		if (victim == nullptr)
		{
			send_to_char("They aren't here.\n\r", ch);
			return;
		}

		if (victim == ch)
		{
			send_to_char("Aye aye, right away!\n\r", ch);
			return;
		}

		/*
		if(victim->desc == nullptr)
		{
			send_to_char("They have no descriptor!\n\r",ch);
			return;
		}
		*/

		if (!is_room_owner(ch, victim->in_room)
			&& ch->in_room != victim->in_room
			&& room_is_private(victim->in_room)
			&& !is_trusted(ch, IMPLEMENTOR))
		{
			send_to_char("That character is in a private room.\n\r", ch);
			return;
		}

		if (get_trust(victim) >= get_trust(ch))
		{
			send_to_char("Do it yourself!\n\r", ch);
			return;
		}

		if (!is_npc(victim) && get_trust(ch) < MAX_LEVEL - 3)
		{
			send_to_char("Not at your level!\n\r", ch);
			return;
		}

		act(buf, ch, nullptr, victim, TO_VICT);
		interpret(victim, argument);
	}

	send_to_char("Ok.\n\r", ch);
}